

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O2

parser_error parse_eff_resist(parser *p)

{
  char *__s1;
  int iVar1;
  wchar_t wVar2;
  void *pvVar3;
  char *name;
  int *piVar4;
  size_t i;
  long lVar5;
  
  pvVar3 = parser_priv(p);
  name = parser_getstr(p,"resist");
  if (pvVar3 == (void *)0x0) {
    __assert_fail("eff",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-init.c"
                  ,0x17e,"enum parser_error parse_eff_resist(struct parser *)");
  }
  __s1 = *(char **)((long)pvVar3 + 0x20);
  iVar1 = strcmp(__s1,"element");
  if (iVar1 == 0) {
    wVar2 = proj_name_to_idx(name);
  }
  else {
    iVar1 = strcmp(__s1,"flag");
    if (iVar1 != 0) {
      return PARSE_ERROR_MISSING_BLOW_EFF_TYPE;
    }
    wVar2 = L'\xffffffff';
    piVar4 = &obj_flags_rel;
    for (lVar5 = 0; lVar5 != 0x2f; lVar5 = lVar5 + 1) {
      iVar1 = strcmp(name,(char *)((long)&obj_flags_rel + (long)*piVar4));
      if (iVar1 == 0) {
        wVar2 = (wchar_t)lVar5;
        break;
      }
      piVar4 = piVar4 + 1;
    }
  }
  *(wchar_t *)((long)pvVar3 + 0x28) = wVar2;
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_eff_resist(struct parser *p) {
	struct blow_effect *eff = parser_priv(p);
	const char *resist = parser_getstr(p, "resist");
	assert(eff);

	if (streq(eff->effect_type, "element")) {
		eff->resist = proj_name_to_idx(resist);
	} else if (streq(eff->effect_type, "flag")) {
		eff->resist = flag_index_by_name(resist);
	} else {
		return PARSE_ERROR_MISSING_BLOW_EFF_TYPE;
	}
	return PARSE_ERROR_NONE;
}